

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O0

void __thiscall
glslang::TBuiltIns::identifyBuiltIns
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion,EShLanguage language,
          TSymbolTable *symbolTable,TBuiltInResource *resources)

{
  bool bVar1;
  TArraySizes *this_00;
  TVariable *this_01;
  TString *name;
  size_t s;
  TArraySizes *arraySizes;
  TType fragData;
  TPrecisionQualifier pq;
  TSymbolTable *symbolTable_local;
  EShLanguage language_local;
  SpvVersion *spvVersion_local;
  EProfile profile_local;
  int version_local;
  TBuiltIns *this_local;
  
  if (((profile != EEsProfile) && (0x1ad < version)) && (version < 0x1b8)) {
    TSymbolTable::setVariableExtensions
              (symbolTable,"gl_MaxTransformFeedbackBuffers",1,&E_GL_ARB_enhanced_layouts);
    TSymbolTable::setVariableExtensions
              (symbolTable,"gl_MaxTransformFeedbackInterleavedComponents",1,
               &E_GL_ARB_enhanced_layouts);
  }
  if (((profile != EEsProfile) && (0x81 < version)) && (version < 0x1a4)) {
    TSymbolTable::setVariableExtensions
              (symbolTable,"gl_MinProgramTexelOffset",1,(char **)&E_GL_ARB_shading_language_420pack)
    ;
    TSymbolTable::setVariableExtensions
              (symbolTable,"gl_MaxProgramTexelOffset",1,(char **)&E_GL_ARB_shading_language_420pack)
    ;
  }
  if (((profile != EEsProfile) && (0x95 < version)) && (version < 0x19a)) {
    TSymbolTable::setVariableExtensions(symbolTable,"gl_MaxViewports",1,&E_GL_ARB_viewport_array);
  }
  if (language - EShLangTessControl < 2) {
    BuiltInVariable("gl_in","gl_Position",EbvPosition,symbolTable);
    BuiltInVariable("gl_in","gl_PointSize",EbvPointSize,symbolTable);
    BuiltInVariable("gl_in","gl_ClipDistance",EbvClipDistance,symbolTable);
    BuiltInVariable("gl_in","gl_CullDistance",EbvCullDistance,symbolTable);
    BuiltInVariable("gl_in","gl_ClipVertex",EbvClipVertex,symbolTable);
    BuiltInVariable("gl_in","gl_FrontColor",EbvFrontColor,symbolTable);
    BuiltInVariable("gl_in","gl_BackColor",EbvBackColor,symbolTable);
    BuiltInVariable("gl_in","gl_FrontSecondaryColor",EbvFrontSecondaryColor,symbolTable);
    BuiltInVariable("gl_in","gl_BackSecondaryColor",EbvBackSecondaryColor,symbolTable);
    BuiltInVariable("gl_in","gl_TexCoord",EbvTexCoord,symbolTable);
    BuiltInVariable("gl_in","gl_FogFragCoord",EbvFogFragCoord,symbolTable);
    TSymbolTable::setVariableExtensions
              (symbolTable,"gl_in","gl_SecondaryPositionNV",1,&E_GL_NV_stereo_view_rendering);
    TSymbolTable::setVariableExtensions
              (symbolTable,"gl_in","gl_PositionPerViewNV",1,&E_GL_NVX_multiview_per_view_attributes)
    ;
    BuiltInVariable("gl_in","gl_SecondaryPositionNV",EbvSecondaryPositionNV,symbolTable);
    BuiltInVariable("gl_in","gl_PositionPerViewNV",EbvPositionPerViewNV,symbolTable);
    if (profile == EEsProfile) {
      TSymbolTable::setVariableExtensions
                (symbolTable,"gl_in","gl_PointSize",2,(char **)AEP_tessellation_point_size);
    }
  }
  else if (language == EShLangFragment) {
    if (((version == 100) || (bVar1 = IncludeLegacy(version,profile,spvVersion), bVar1)) ||
       ((profile != EEsProfile && (version < 0x1a4)))) {
      fragData.spirvType._4_4_ = EpqNone;
      if (profile == EEsProfile) {
        fragData.spirvType._4_4_ = EpqMedium;
      }
      s = 1;
      TType::TType((TType *)&arraySizes,EbtFloat,EvqFragColor,fragData.spirvType._4_4_,4,0,0,false);
      this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,s);
      TArraySizes::TArraySizes(this_00);
      TArraySizes::addInnerSize(this_00,resources->maxDrawBuffers);
      TType::transferArraySizes((TType *)&arraySizes,this_00);
      this_01 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)this_00);
      name = NewPoolTString_abi_cxx11_("gl_FragData");
      TVariable::TVariable(this_01,name,(TType *)&arraySizes,false);
      TSymbolTable::insert(symbolTable,(TSymbol *)this_01);
      SpecialQualifier("gl_FragData",EvqFragColor,EbvFragData,symbolTable);
      TType::~TType((TType *)&arraySizes);
    }
    if ((profile == EEsProfile) && (99 < version)) {
      TSymbolTable::setVariableExtensions
                (symbolTable,"gl_MaxDualSourceDrawBuffersEXT",1,&E_GL_EXT_blend_func_extended);
      TSymbolTable::setVariableExtensions
                (symbolTable,"gl_SecondaryFragColorEXT",1,&E_GL_EXT_blend_func_extended);
      TSymbolTable::setVariableExtensions
                (symbolTable,"gl_SecondaryFragDataEXT",1,&E_GL_EXT_blend_func_extended);
      SpecialQualifier("gl_SecondaryFragColorEXT",EvqVaryingOut,EbvSecondaryFragColorEXT,symbolTable
                      );
      SpecialQualifier("gl_SecondaryFragDataEXT",EvqVaryingOut,EbvSecondaryFragDataEXT,symbolTable);
    }
  }
  return;
}

Assistant:

void TBuiltIns::identifyBuiltIns(int version, EProfile profile, const SpvVersion& spvVersion, EShLanguage language, TSymbolTable& symbolTable, const TBuiltInResource &resources)
{
    if (profile != EEsProfile && version >= 430 && version < 440) {
        symbolTable.setVariableExtensions("gl_MaxTransformFeedbackBuffers", 1, &E_GL_ARB_enhanced_layouts);
        symbolTable.setVariableExtensions("gl_MaxTransformFeedbackInterleavedComponents", 1, &E_GL_ARB_enhanced_layouts);
    }
    if (profile != EEsProfile && version >= 130 && version < 420) {
        symbolTable.setVariableExtensions("gl_MinProgramTexelOffset", 1, &E_GL_ARB_shading_language_420pack);
        symbolTable.setVariableExtensions("gl_MaxProgramTexelOffset", 1, &E_GL_ARB_shading_language_420pack);
    }
    if (profile != EEsProfile && version >= 150 && version < 410)
        symbolTable.setVariableExtensions("gl_MaxViewports", 1, &E_GL_ARB_viewport_array);

    switch(language) {
    case EShLangFragment:
        // Set up gl_FragData based on current array size.
        if (version == 100 || IncludeLegacy(version, profile, spvVersion) || (! ForwardCompatibility && profile != EEsProfile && version < 420)) {
            TPrecisionQualifier pq = profile == EEsProfile ? EpqMedium : EpqNone;
            TType fragData(EbtFloat, EvqFragColor, pq, 4);
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(resources.maxDrawBuffers);
            fragData.transferArraySizes(arraySizes);
            symbolTable.insert(*new TVariable(NewPoolTString("gl_FragData"), fragData));
            SpecialQualifier("gl_FragData", EvqFragColor, EbvFragData, symbolTable);
        }

        // GL_EXT_blend_func_extended
        if (profile == EEsProfile && version >= 100) {
           symbolTable.setVariableExtensions("gl_MaxDualSourceDrawBuffersEXT",    1, &E_GL_EXT_blend_func_extended);
           symbolTable.setVariableExtensions("gl_SecondaryFragColorEXT",    1, &E_GL_EXT_blend_func_extended);
           symbolTable.setVariableExtensions("gl_SecondaryFragDataEXT",    1, &E_GL_EXT_blend_func_extended);
           SpecialQualifier("gl_SecondaryFragColorEXT", EvqVaryingOut, EbvSecondaryFragColorEXT, symbolTable);
           SpecialQualifier("gl_SecondaryFragDataEXT", EvqVaryingOut, EbvSecondaryFragDataEXT, symbolTable);
        }

        break;

    case EShLangTessControl:
    case EShLangTessEvaluation:
        // Because of the context-dependent array size (gl_MaxPatchVertices),
        // these variables were added later than the others and need to be mapped now.

        // standard members
        BuiltInVariable("gl_in", "gl_Position",     EbvPosition,     symbolTable);
        BuiltInVariable("gl_in", "gl_PointSize",    EbvPointSize,    symbolTable);
        BuiltInVariable("gl_in", "gl_ClipDistance", EbvClipDistance, symbolTable);
        BuiltInVariable("gl_in", "gl_CullDistance", EbvCullDistance, symbolTable);

        // compatibility members
        BuiltInVariable("gl_in", "gl_ClipVertex",          EbvClipVertex,          symbolTable);
        BuiltInVariable("gl_in", "gl_FrontColor",          EbvFrontColor,          symbolTable);
        BuiltInVariable("gl_in", "gl_BackColor",           EbvBackColor,           symbolTable);
        BuiltInVariable("gl_in", "gl_FrontSecondaryColor", EbvFrontSecondaryColor, symbolTable);
        BuiltInVariable("gl_in", "gl_BackSecondaryColor",  EbvBackSecondaryColor,  symbolTable);
        BuiltInVariable("gl_in", "gl_TexCoord",            EbvTexCoord,            symbolTable);
        BuiltInVariable("gl_in", "gl_FogFragCoord",        EbvFogFragCoord,        symbolTable);

        symbolTable.setVariableExtensions("gl_in", "gl_SecondaryPositionNV", 1, &E_GL_NV_stereo_view_rendering);
        symbolTable.setVariableExtensions("gl_in", "gl_PositionPerViewNV",   1, &E_GL_NVX_multiview_per_view_attributes);

        BuiltInVariable("gl_in", "gl_SecondaryPositionNV", EbvSecondaryPositionNV, symbolTable);
        BuiltInVariable("gl_in", "gl_PositionPerViewNV",   EbvPositionPerViewNV,   symbolTable);

        // extension requirements
        if (profile == EEsProfile) {
            symbolTable.setVariableExtensions("gl_in", "gl_PointSize", Num_AEP_tessellation_point_size, AEP_tessellation_point_size);
        }

        break;

    default:
        break;
    }
}